

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deferred_guarded.hpp
# Opt level: O2

void __thiscall gmlc::libguarded::void_runner<int>::run_task(void_runner<int> *this,int *obj)

{
  handle local_28;
  
  guarded<std::packaged_task<void_(int_&)>,_std::mutex>::lock(&local_28,&this->task);
  std::packaged_task<void_(int_&)>::operator()(local_28.data,obj);
  std::unique_lock<std::mutex>::~unique_lock(&local_28.m_handle_lock);
  return;
}

Assistant:

virtual void run_task(T& obj) { task.lock()->operator()(obj); }